

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftext.c
# Opt level: O1

void ffts(float *data,long M,long Rows)

{
  ffts1(data,M,Rows,UtblArray[M],BRLowArray[(ulong)(M - (M >> 0x3f)) >> 1]);
  return;
}

Assistant:

void ffts(float *data, long M, long Rows){
/* Compute in-place complex fft on the rows of the input array	*/
/* INPUTS */
/* *ioptr = input data array	*/
/* M = log2 of fft size	(ex M=10 for 1024 point fft) */
/* Rows = number of rows in ioptr array (use 1 for Rows for a single fft)	*/
/* OUTPUTS */
/* *ioptr = output data array	*/
	ffts1(data, M, Rows, UtblArray[M], BRLowArray[M/2]);
}